

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O0

ostream * vk::operator<<(ostream *str,AllocationCallbackRecord *record)

{
  Hex<16UL> HVar1;
  ostream *poVar2;
  char *pcVar3;
  AllocationCallbackRecord *record_local;
  ostream *str_local;
  
  switch(record->type) {
  case TYPE_ALLOCATION:
    poVar2 = std::operator<<(str,"ALLOCATION: size=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).allocation.size);
    poVar2 = std::operator<<(poVar2,", alignment=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).allocation.alignment);
    poVar2 = std::operator<<(poVar2,", scope=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).allocation.scope);
    poVar2 = std::operator<<(poVar2,", returnedPtr=");
    HVar1 = tcu::toHex<void_*>((record->data).allocation.returnedPtr);
    tcu::Format::operator<<(poVar2,HVar1);
    break;
  case TYPE_REALLOCATION:
    poVar2 = std::operator<<(str,"REALLOCATION: original=");
    HVar1 = tcu::toHex<void_*>((record->data).reallocation.original);
    poVar2 = tcu::Format::operator<<(poVar2,HVar1);
    poVar2 = std::operator<<(poVar2,", size=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).allocation.alignment);
    poVar2 = std::operator<<(poVar2,", alignment=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).reallocation.alignment);
    poVar2 = std::operator<<(poVar2,", scope=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).reallocation.scope);
    poVar2 = std::operator<<(poVar2,", returnedPtr=");
    HVar1 = tcu::toHex<void_*>((record->data).reallocation.returnedPtr);
    tcu::Format::operator<<(poVar2,HVar1);
    break;
  case TYPE_FREE:
    poVar2 = std::operator<<(str,"FREE: mem=");
    HVar1 = tcu::toHex<void_*>((record->data).reallocation.original);
    tcu::Format::operator<<(poVar2,HVar1);
    break;
  case TYPE_INTERNAL_ALLOCATION:
  case TYPE_INTERNAL_FREE:
    poVar2 = std::operator<<(str,"INTERNAL_");
    pcVar3 = "FREE";
    if (record->type == TYPE_INTERNAL_ALLOCATION) {
      pcVar3 = "ALLOCATION";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,": size=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).allocation.size);
    poVar2 = std::operator<<(poVar2,", type=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(record->data).internalAllocation.type);
    poVar2 = std::operator<<(poVar2,", scope=");
    std::ostream::operator<<(poVar2,(record->data).internalAllocation.scope);
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const AllocationCallbackRecord& record)
{
	switch (record.type)
	{
		case AllocationCallbackRecord::TYPE_ALLOCATION:
			str << "ALLOCATION: size=" << record.data.allocation.size
				<< ", alignment=" << record.data.allocation.alignment
				<< ", scope=" << record.data.allocation.scope
				<< ", returnedPtr=" << tcu::toHex(record.data.allocation.returnedPtr);
			break;

		case AllocationCallbackRecord::TYPE_REALLOCATION:
			str << "REALLOCATION: original=" << tcu::toHex(record.data.reallocation.original)
				<< ", size=" << record.data.reallocation.size
				<< ", alignment=" << record.data.reallocation.alignment
				<< ", scope=" << record.data.reallocation.scope
				<< ", returnedPtr=" << tcu::toHex(record.data.reallocation.returnedPtr);
			break;

		case AllocationCallbackRecord::TYPE_FREE:
			str << "FREE: mem=" << tcu::toHex(record.data.free.mem);
			break;

		case AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION:
		case AllocationCallbackRecord::TYPE_INTERNAL_FREE:
			str << "INTERNAL_" << (record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION ? "ALLOCATION" : "FREE")
				<< ": size=" << record.data.internalAllocation.size
				<< ", type=" << record.data.internalAllocation.type
				<< ", scope=" << record.data.internalAllocation.scope;
			break;

		default:
			DE_ASSERT(false);
	}

	return str;
}